

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O1

curltime Curl_now(void)

{
  int iVar1;
  timespec *__tv;
  curltime cVar2;
  timespec tsnow;
  timeval now;
  timespec tStack_28;
  timeval local_18;
  
  __tv = &tStack_28;
  iVar1 = clock_gettime(4,&tStack_28);
  if (iVar1 != 0) {
    iVar1 = clock_gettime(1,&tStack_28);
    if (iVar1 != 0) {
      __tv = (timespec *)&local_18;
      gettimeofday((timeval *)__tv,(__timezone_ptr_t)0x0);
      goto LAB_0015dcdf;
    }
  }
  local_18.tv_usec = tStack_28.tv_nsec / 1000;
LAB_0015dcdf:
  cVar2._8_8_ = local_18.tv_usec;
  cVar2.tv_sec = ((timeval *)__tv)->tv_sec;
  return cVar2;
}

Assistant:

struct curltime Curl_now(void)
{
  /*
  ** gettimeofday() is not granted to be increased monotonically, due to
  ** clock drifting and external source time synchronization it can jump
  ** forward or backward in time.
  */
  struct timeval now;
  struct curltime ret;
  (void)gettimeofday(&now, NULL);
  ret.tv_sec = now.tv_sec;
  ret.tv_usec = (int)now.tv_usec;
  return ret;
}